

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmargins.h
# Opt level: O2

bool __thiscall QMarginsF::isNull(QMarginsF *this)

{
  double dVar1;
  ulong uVar2;
  
  dVar1 = this->m_left;
  uVar2 = -(ulong)(dVar1 < -dVar1);
  if ((((double)(~uVar2 & (ulong)dVar1 | (ulong)-dVar1 & uVar2) <= 1e-12) &&
      (dVar1 = this->m_top, uVar2 = -(ulong)(dVar1 < -dVar1),
      (double)(~uVar2 & (ulong)dVar1 | (ulong)-dVar1 & uVar2) <= 1e-12)) &&
     (dVar1 = this->m_right, uVar2 = -(ulong)(dVar1 < -dVar1),
     (double)(~uVar2 & (ulong)dVar1 | (ulong)-dVar1 & uVar2) <= 1e-12)) {
    dVar1 = this->m_bottom;
    uVar2 = -(ulong)(dVar1 < -dVar1);
    return (double)(~uVar2 & (ulong)dVar1 | (ulong)-dVar1 & uVar2) <= 1e-12;
  }
  return false;
}

Assistant:

constexpr inline bool QMarginsF::isNull() const noexcept
{ return qFuzzyIsNull(m_left) && qFuzzyIsNull(m_top) && qFuzzyIsNull(m_right) && qFuzzyIsNull(m_bottom); }